

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  Fts3MultiSegReader *pCsr;
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *a2;
  int i;
  long lVar5;
  size_t __n;
  long lVar6;
  long in_FS_OFFSET;
  char *aNew;
  int nNew;
  undefined1 local_120 [24];
  char *local_108;
  int local_fc;
  char *local_f8;
  long local_f0 [14];
  char *pcStack_80;
  int local_78 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pCsr = pTok->pSegcsr;
  memset(&local_f8,0,0xc0);
  local_120._16_4_ =
       (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
       (uint)(iColumn < p->nColumn) * 4;
  local_120._0_8_ = pTok->z;
  local_120._8_4_ = pTok->n;
  pCsr->pFilter = (Fts3SegFilter *)local_120;
  local_120._12_4_ = iColumn;
  iVar2 = fts3SegReaderStart(p,pCsr,(char *)local_120._0_8_,local_120._8_4_);
  if (iVar2 == 0) {
LAB_001caf88:
    iVar2 = sqlite3Fts3SegReaderStep(p,pCsr);
    if (iVar2 == 100) {
      pcVar1 = pCsr->aDoclist;
      iVar2 = pCsr->nDoclist;
      if (local_f8 == (char *)0x0) {
        iVar3 = sqlite3_initialize();
        if (iVar3 != 0) {
          local_f8 = (char *)0x0;
          iVar2 = 7;
          goto LAB_001cb0d3;
        }
        __n = (size_t)iVar2;
        pcVar4 = (char *)sqlite3Malloc(__n + 0xb);
        local_f8 = pcVar4;
        local_78[0] = iVar2;
        if (pcVar4 == (char *)0x0) {
          iVar2 = 7;
          goto LAB_001cb0d3;
        }
        memcpy(pcVar4,pcVar1,__n);
        pcVar1 = pcVar4 + __n;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        (pcVar4 + __n + 8)[0] = '\0';
        (pcVar4 + __n + 8)[1] = '\0';
      }
      else {
        a2 = local_f8;
        pcVar4 = pcVar1;
        lVar5 = 0;
        do {
          lVar6 = lVar5;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          local_fc = -0x55555556;
          iVar2 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar4,iVar2,a2,local_78[lVar6],&local_108,
                                     &local_fc);
          if (iVar2 != 0) {
            if (pcVar4 == pcVar1) goto LAB_001cb0d3;
            goto LAB_001cb0c1;
          }
          if (pcVar4 != pcVar1) {
            sqlite3_free(pcVar4);
          }
          sqlite3_free((void *)local_f0[lVar6 + -1]);
          local_f0[lVar6 + -1] = 0;
          if (lVar6 == 0xf) {
            pcStack_80 = local_108;
            local_78[0xf] = local_fc;
            goto LAB_001caf88;
          }
          a2 = (char *)local_f0[lVar6];
          pcVar4 = local_108;
          lVar5 = lVar6 + 1;
          iVar2 = local_fc;
        } while (a2 != (char *)0x0);
        local_f0[lVar6] = (long)local_108;
        local_78[lVar6 + 1] = local_fc;
      }
      goto LAB_001caf88;
    }
    if (iVar2 == 0) {
      lVar5 = 0;
      pcVar4 = (char *)0x0;
      iVar2 = 0;
      do {
        pcVar1 = (char *)local_f0[lVar5 + -1];
        if (pcVar1 != (char *)0x0) {
          if (pcVar4 == (char *)0x0) {
            iVar2 = local_78[lVar5];
            local_f0[lVar5 + -1] = 0;
            pcVar4 = pcVar1;
          }
          else {
            local_fc = -0x55555556;
            local_108 = &DAT_aaaaaaaaaaaaaaaa;
            iVar2 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar1,local_78[lVar5],pcVar4,iVar2,
                                       &local_108,&local_fc);
            if (iVar2 != 0) goto LAB_001cb0c1;
            sqlite3_free((void *)local_f0[lVar5 + -1]);
            sqlite3_free(pcVar4);
            local_f0[lVar5 + -1] = 0;
            pcVar4 = local_108;
            iVar2 = local_fc;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      *ppOut = pcVar4;
      *pnOut = iVar2;
      iVar2 = 0;
      goto LAB_001cb0e8;
    }
  }
  goto LAB_001cb0d3;
LAB_001cb0c1:
  sqlite3_free(pcVar4);
LAB_001cb0d3:
  lVar5 = 0;
  do {
    sqlite3_free((void *)local_f0[lVar5 + -1]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
LAB_001cb0e8:
  sqlite3Fts3SegReaderFinish(pCsr);
  sqlite3_free(pCsr);
  pTok->pSegcsr = (Fts3MultiSegReader *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr))
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}